

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O2

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  uint uVar1;
  bool bVar2;
  istream *piVar3;
  allocator local_51;
  string local_50;
  
  do {
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)ifile,(string *)line);
      uVar1 = *(uint *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) goto LAB_0011a934;
      limonp::Trim(line);
    } while (line->_M_string_length == 0);
    std::__cxx11::string::string((string *)&local_50,"#",&local_51);
    bVar2 = limonp::StartsWith(line,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while (bVar2);
LAB_0011a934:
  return (uVar1 & 5) == 0;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }